

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::GetNext(Cluster *this,BlockEntry *pCurr,BlockEntry **pNext)

{
  long lVar1;
  long status;
  long len;
  longlong pos;
  size_t idx;
  BlockEntry **pNext_local;
  BlockEntry *pCurr_local;
  Cluster *this_local;
  
  idx = (size_t)pNext;
  pNext_local = (BlockEntry **)pCurr;
  pCurr_local = (BlockEntry *)this;
  if (pCurr == (BlockEntry *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ce9,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  if (this->m_entries == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cea,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  if (this->m_entries_count < 1) {
    __assert_fail("m_entries_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ceb,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  pos = BlockEntry::GetIndex(pCurr);
  if ((ulong)this->m_entries_count <= (ulong)pos) {
    __assert_fail("idx < size_t(m_entries_count)",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cee,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  if (this->m_entries[pos] != (BlockEntry *)pNext_local) {
    __assert_fail("m_entries[idx] == pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cef,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  pos = pos + 1;
  if ((ulong)this->m_entries_count <= (ulong)pos) {
    lVar1 = Parse(this,&len,&status);
    if (lVar1 < 0) {
      *(undefined8 *)idx = 0;
      return lVar1;
    }
    if (0 < lVar1) {
      *(undefined8 *)idx = 0;
      return 0;
    }
    if (this->m_entries == (BlockEntry **)0x0) {
      __assert_fail("m_entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d03,
                    "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                   );
    }
    if (this->m_entries_count < 1) {
      __assert_fail("m_entries_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d04,
                    "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                   );
    }
    if ((ulong)this->m_entries_count <= (ulong)pos) {
      __assert_fail("idx < size_t(m_entries_count)",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d05,
                    "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                   );
    }
  }
  *(BlockEntry **)idx = this->m_entries[pos];
  if (*(long *)idx != 0) {
    return 0;
  }
  __assert_fail("pNext",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1d09,
                "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const");
}

Assistant:

long Cluster::GetNext(const BlockEntry* pCurr, const BlockEntry*& pNext) const {
  assert(pCurr);
  assert(m_entries);
  assert(m_entries_count > 0);

  size_t idx = pCurr->GetIndex();
  assert(idx < size_t(m_entries_count));
  assert(m_entries[idx] == pCurr);

  ++idx;

  if (idx >= size_t(m_entries_count)) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pNext = NULL;
      return status;
    }

    if (status > 0) {
      pNext = NULL;
      return 0;
    }

    assert(m_entries);
    assert(m_entries_count > 0);
    assert(idx < size_t(m_entries_count));
  }

  pNext = m_entries[idx];
  assert(pNext);

  return 0;
}